

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadImageLibrary(ColladaParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar6;
  undefined4 extraout_var_01;
  string id;
  string local_a8;
  pointer local_88;
  pointer puStack_80;
  pointer local_78;
  undefined8 *puStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  key_type local_50;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar3 != '\0')) {
    paVar1 = &local_a8.field_2;
    do {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar3 == 1) {
        if (iVar4 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"image");
        if (iVar3 == 0) {
          uVar5 = GetAttribute(this,"id");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar5);
          std::__cxx11::string::string
                    ((string *)&local_50,(char *)CONCAT44(extraout_var_00,iVar3),
                     (allocator *)&local_a8);
          local_58 = 0;
          local_68 = 0;
          local_a8.field_2._M_allocated_capacity = 0;
          local_a8.field_2._8_8_ = 0;
          local_a8._M_string_length = 0;
          local_78 = (pointer)0x0;
          local_88 = (pointer)0x0;
          puStack_80 = (pointer)0x0;
          puStack_70 = &uStack_60;
          uStack_60 = 0;
          local_a8._M_dataplus._M_p = (pointer)paVar1;
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,&local_50);
          std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_a8);
          puVar2 = (pmVar6->mImageData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          (pmVar6->mImageData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = local_88;
          (pmVar6->mImageData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = puStack_80;
          (pmVar6->mImageData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
          local_88 = (pointer)0x0;
          puStack_80 = (pointer)0x0;
          local_78 = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          std::__cxx11::string::operator=((string *)&pmVar6->mEmbeddedFormat,(string *)&puStack_70);
          if (puStack_70 != &uStack_60) {
            operator_delete(puStack_70);
          }
          if (local_88 != (pointer)0x0) {
            operator_delete(local_88);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,&local_50);
          ReadImage(this,pmVar6);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar4 == 2) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"library_images");
        if (iVar3 == 0) {
          return;
        }
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Expected end of <library_images> element.","");
        ThrowException(this,&local_a8);
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar3 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadImageLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("image"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mImageLibrary[id] = Image();

                // read on from there
                ReadImage(mImageLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_images") != 0)
                ThrowException("Expected end of <library_images> element.");

            break;
        }
    }
}